

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser-count.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  reference ppcVar4;
  exception *e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cell_count;
  filtered_directed_graph_t graph;
  char *input_filename;
  const_iterator it;
  flagser_parameters params;
  named_arguments_t named_arguments;
  positional_arguments_t positional_arguments;
  cli_arguments_t arguments;
  cli_arguments_t *in_stack_fffffffffffffcd8;
  filtered_directed_graph_t *in_stack_fffffffffffffce0;
  allocator *this;
  allocator local_2c9;
  string local_2c8 [104];
  flagser_parameters *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_1c8;
  allocator local_1b9;
  string local_1b8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_198 [7];
  char **in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  vector<const_char_*,_std::allocator<const_char_*>_> local_88 [5];
  int local_4;
  
  local_4 = 0;
  parse_arguments_abi_cxx11_(in_stack_fffffffffffffeac,in_stack_fffffffffffffea0);
  get_positional_arguments(in_stack_fffffffffffffcd8);
  get_named_arguments(in_stack_fffffffffffffcd8);
  flagser_parameters::flagser_parameters
            ((flagser_parameters *)params.output_format._0_8_,
             (named_arguments_t *)params.output_name.field_2._8_8_);
  std::__detail::
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
              *)0x139f31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"help",&local_1b9);
  local_198[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               *)in_stack_fffffffffffffcd8,(key_type *)0x139f75);
  local_1c8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
              *)in_stack_fffffffffffffcd8);
  bVar2 = std::__detail::operator!=(local_198,&local_1c8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  if (bVar2) {
    print_usage_and_exit(0);
  }
  sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(local_88);
  if (sVar3 == 0) {
    print_usage_and_exit(0);
  }
  ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_88,0);
  pcVar1 = *ppcVar4;
  this = &local_2c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,pcVar1,this);
  read_filtered_directed_graph(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  count_cells((filtered_directed_graph_t *)
              graph.super_directed_graph_t.indegrees.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish,
              (flagser_parameters *)
              graph.super_directed_graph_t.indegrees.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  filtered_directed_graph_t::~filtered_directed_graph_t(in_stack_fffffffffffffce0);
  flagser_parameters::~flagser_parameters((flagser_parameters *)in_stack_fffffffffffffce0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                    *)0x13a1a1);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)this);
  std::
  pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
  ::~pair((pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
           *)in_stack_fffffffffffffce0);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
	try {
		auto arguments = parse_arguments(argc, argv);

		auto positional_arguments = get_positional_arguments(arguments);
		auto named_arguments = get_named_arguments(arguments);
		auto params = flagser_parameters(named_arguments);
		named_arguments_t::const_iterator it;
		if (named_arguments.find("help") != named_arguments.end()) { print_usage_and_exit(-1); }

		if (positional_arguments.size() == 0) { print_usage_and_exit(-1); }
		const char* input_filename = positional_arguments[0];

		filtered_directed_graph_t graph = read_filtered_directed_graph(input_filename, params);

		auto cell_count = count_cells(graph, params);
	} catch (const std::exception& e) { std::cout << e.what() << std::endl; }
}